

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

int mattacku(monst *mtmp)

{
  int *piVar1;
  char cVar2;
  uchar uVar3;
  ushort uVar4;
  bool bVar5;
  monst *pmVar6;
  boolean bVar7;
  schar sVar8;
  boolean bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  obj *poVar13;
  permonst *ppVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  attack *mattk;
  trap *ptVar18;
  char *pcVar19;
  byte bVar20;
  ulong uVar21;
  obj **obj;
  byte bVar22;
  bool bVar23;
  bool foundyou;
  bool bVar24;
  int local_2b0;
  int local_294;
  permonst *local_290;
  int sum [6];
  attack alt_attk;
  coord cc;
  musable musable;
  
  local_290 = mtmp->data;
  iVar10 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  bVar7 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
  bVar23 = bVar7 == '\0';
  if (mtmp->mux == u.ux) {
    foundyou = mtmp->muy == u.uy;
  }
  else {
    foundyou = false;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001c2e36;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c2dd0;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c2dcb;
    }
    else {
LAB_001c2dcb:
      if (ublindf == (obj *)0x0) goto LAB_001c2d90;
LAB_001c2dd0:
      bVar22 = 1;
      if (ublindf->oartifact != '\x1d') goto LAB_001c2e8e;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (bVar22 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)) &&
        (bVar22 = 1, (viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) &&
       ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001c2e36;
  }
  else {
    bVar7 = worm_known(level,mtmp);
    if (bVar7 == '\0') {
LAB_001c2d90:
      bVar22 = 1;
    }
    else {
LAB_001c2e36:
      uVar11 = *(uint *)&mtmp->field_0x60;
      if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar22 = 1;
        if (-1 < (char)uVar11) goto LAB_001c2e76;
      }
      else {
        bVar22 = 1;
        if ((-1 < (char)uVar11) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c2e76:
          bVar22 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar11 >> 9) & 1;
        }
      }
    }
  }
LAB_001c2e8e:
  if (iVar10 < 4) {
    nomul(0,(char *)0x0);
  }
  pmVar6 = u.ustuck;
  if (mtmp->mhp < 1) {
    return 0;
  }
  if (((u._1052_1_ & 2) != 0) && ((mtmp->data->mflags1 & 2) == 0)) {
    return 0;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (u.usteed != (monst *)0x0) {
      if (u.usteed == mtmp) {
        return 0;
      }
      iVar10 = rn2((uint)(-1 < (char)mtmp->data->mflags2) * 2 + 2);
      if ((iVar10 == 0) &&
         (iVar10 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar10 < 3)) {
        uVar11 = mattackm(mtmp,u.usteed);
        if ((uVar11 & 4) != 0) {
          return 1;
        }
        if ((uVar11 & 2) == 0) {
          if (u.umoved == '\0') {
            uVar11 = mattackm(u.usteed,mtmp);
            return uVar11 >> 1 & 1;
          }
          return 0;
        }
        return 0;
      }
    }
  }
  else {
    if (u.ustuck != mtmp) {
      return 0;
    }
    (u.ustuck)->mux = u.ux;
    pmVar6->muy = u.uy;
    bVar23 = false;
    if ((u._1052_1_ & 0x10) != 0) {
      return 0;
    }
    foundyou = true;
  }
  ppVar14 = youmonst.data;
  if (((((u._1052_1_ & 1) == 0) && ((u._1052_1_ & 4) != 0)) && (!bVar23)) && (foundyou != false)) {
    u._1052_1_ = u._1052_1_ & 0xfa;
    if (((youmonst.data)->mflags1 & 0x100) != 0) {
      pcVar15 = ceiling((int)u.ux,(int)u.uy);
      pline("You fall from the %s!",pcVar15);
      bVar7 = enexto(&cc,level,u.ux,u.uy,youmonst.data);
      if (bVar7 == '\0') {
        pcVar15 = Monnam(mtmp);
        pcVar16 = mons_mname(youmonst.data);
        pline("%s is killed by a falling %s (you)!",pcVar15,pcVar16);
        killed(mtmp);
        newsym((int)u.ux,(int)u.uy);
        return (uint)(mtmp->mhp < 1);
      }
      remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
      newsym((int)mtmp->mx,(int)mtmp->my);
      place_monster(mtmp,(int)u.ux,(int)u.uy);
      if (mtmp->wormno != '\0') {
        worm_move(mtmp);
      }
      teleds((int)cc.x,(int)cc.y,'\x01');
      set_apparxy(level,mtmp);
      newsym((int)u.ux,(int)u.uy);
      if ((youmonst.data)->mlet == '\x10') {
        poVar13 = which_armor(mtmp,4);
        if ((poVar13 == (obj *)0x0) ||
           (6 < (ushort)((*(ushort *)&objects[poVar13->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
          iVar10 = find_mac(mtmp);
          iVar12 = rnd(0x14);
          pcVar15 = Monnam(mtmp);
          if (iVar10 + 3 <= iVar12) {
            pline("%s is hit by a falling piercer (you)!",pcVar15);
            iVar12 = dice(3,6);
            piVar1 = &mtmp->mhp;
            iVar10 = *piVar1;
            *piVar1 = *piVar1 - iVar12;
            if (*piVar1 != 0 && SBORROW4(iVar10,iVar12) == *piVar1 < 0) {
              return 0;
            }
            killed(mtmp);
            return 0;
          }
          pcVar16 = "%s is almost hit by a falling piercer (you)!";
        }
        else {
          pcVar15 = mon_nam(mtmp);
          pcVar15 = s_suffix(pcVar15);
          pcVar16 = "Your blow glances off %s helmet.";
        }
        pline(pcVar16,pcVar15);
        return 0;
      }
      return 0;
    }
    if (bVar22 == 0) {
      poVar13 = level->objects[u.ux][u.uy];
      if (poVar13 == (obj *)0x0) {
        if (((youmonst.data)->mlet != '9') ||
           (bVar7 = is_pool(level,(int)u.ux,(int)u.uy), bVar7 == '\0')) {
          warning("hiding under nothing?");
          goto LAB_001c32f4;
        }
        sVar8 = '\0';
        ppVar14 = youmonst.data;
      }
      else {
        sVar8 = poVar13->spe;
        if (poVar13->otyp == 0x10f) {
          poVar13->spe = '\0';
        }
      }
      cVar2 = ppVar14->mlet;
      pcVar15 = m_monnam(mtmp);
      pcVar16 = mons_mname(youmonst.data);
      if (cVar2 == '9') {
        pline("Wait, %s!  There\'s a hidden %s named %s there!",pcVar15,pcVar16,plname);
      }
      else {
        pcVar17 = doname(level->objects[u.ux][u.uy]);
        pline("Wait, %s!  There\'s a %s named %s hiding under %s!",pcVar15,pcVar16,plname,pcVar17);
      }
      if (poVar13 != (obj *)0x0) {
        poVar13->spe = sVar8;
      }
    }
    else {
      pline("It tries to move where you are hiding.");
    }
LAB_001c32f4:
    newsym((int)u.ux,(int)u.uy);
    return 0;
  }
  if (((!(bool)(youmonst.m_ap_type == '\0' | bVar23) && foundyou != false) && (u._1052_1_ & 1) == 0)
      && (youmonst.data)->mlet == '\r') {
    if (bVar22 == 0) {
      pcVar15 = m_monnam(mtmp);
      pcVar16 = mons_mname(youmonst.data);
      pline("Wait, %s!  That\'s a %s named %s!",pcVar15,pcVar16,plname);
    }
    else {
      pline("It gets stuck on you.");
    }
    youmonst.m_ap_type = '\0';
    youmonst.mappearance = 0;
    u.ustuck = mtmp;
    goto LAB_001c32f4;
  }
  if (((foundyou != false && !bVar23) && (u._1052_1_ & 1) == 0) && youmonst.m_ap_type == '\x02') {
    if (bVar22 == 0) {
      pcVar15 = m_monnam(mtmp);
      pcVar16 = mimic_obj_name(&youmonst);
      pcVar17 = mons_mname(mons + u.umonnum);
      pcVar17 = an(pcVar17);
      pline("Wait, %s!  That %s is really %s named %s!",pcVar15,pcVar16,pcVar17,plname);
    }
    else {
      pcVar15 = "tries to pick you up";
      if (youmonst.mappearance != 0x1ef) {
        pcVar15 = "disturbs you";
      }
      if ((mtmp->data->mflags2 & 0x10000000) == 0) {
        pcVar15 = "disturbs you";
      }
      pline("Something %s!",pcVar15);
    }
    if (multi < 0) {
      if (u.umonnum == u.umonster) {
        pcVar15 = "yourself";
      }
      else {
        pcVar15 = mons_mname(youmonst.data);
        pcVar15 = an(pcVar15);
      }
      sprintf(&cc.x,"You appear to be %s again.",pcVar15);
      unmul(&cc.x);
      return 0;
    }
    return 0;
  }
  iVar10 = (int)u.uac;
  if (u.uac < '\0') {
    iVar10 = rnd(-iVar10);
    iVar10 = -iVar10;
  }
  iVar10 = (uint)mtmp->m_lev + iVar10 + (multi >> 0x1f) * -4;
  iVar12 = iVar10 + 10;
  if ((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
        (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
      (u.uprops[0xd].blocked == 0)) && ((local_290->mflags1 & 0x1000000) == 0)) {
    uVar11 = *(uint *)&mtmp->field_0x60;
LAB_001c3361:
    iVar12 = iVar10 + 8;
  }
  else {
    uVar11 = *(uint *)&mtmp->field_0x60;
    if ((uVar11 >> 0x11 & 1) == 0) goto LAB_001c3361;
  }
  local_294 = iVar12 + -2;
  if ((uVar11 >> 0x17 & 1) == 0) {
    local_294 = iVar12;
  }
  if (local_294 < 2) {
    local_294 = 1;
  }
  if ((local_290->mlet == '9') && ((uVar11 & 2) != 0)) {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      *(uint *)&mtmp->field_0x60 = uVar11 & 0xfffffffd;
      newsym((int)mtmp->mx,(int)mtmp->my);
      uVar11 = *(uint *)&mtmp->field_0x60;
    }
  }
  if ((((uVar11 & 0x70) == 0) && ((local_290->mflags2 & 0x200) != 0 && !bVar23)) &&
     (ppVar14 = mtmp->data,
     ppVar14 != mons + 0x130 && (ppVar14 != mons + 0x12f && ppVar14 != mons + 0x13a))) {
    if (uwep == (obj *)0x0) {
      if ((uVar11 >> 8 & 1) == 0) goto LAB_001c3660;
    }
    else if (((uVar11 >> 8 & 1) == 0) && (uwep->oartifact != '\x0e')) {
LAB_001c3660:
      uVar11 = mt_random();
      if (uVar11 % 0xd == 0) {
        msummon(mtmp,&mtmp->dlevel->z);
      }
    }
  }
  if (((mtmp->field_0x60 & 0x70) == 0) && ((local_290->mflags2 & 4) != 0 && !bVar23)) {
    if ((local_290->mflags2 & 8) == 0) {
      uVar11 = mt_random();
      uVar11 = uVar11 % 0x1e;
    }
    else {
      iVar10 = night();
      uVar11 = rn2(iVar10 * -2 + 5);
    }
    if ((uVar11 == 0) && ((mtmp->field_0x61 & 1) == 0)) {
      new_were(mtmp);
    }
    local_290 = mtmp->data;
    uVar11 = mt_random();
    if ((uVar11 % 10 == 0) && ((mtmp->field_0x61 & 1) == 0)) {
      musable.offensive = (obj *)0x6572757461657263;
      musable.defensive = (obj *)((ulong)musable.defensive & 0xffffffffffffff00);
      iVar10 = were_summon(local_290,'\0',sum,(char *)&musable);
      if (bVar22 == 0) {
        pcVar15 = Monnam(mtmp);
        pline("%s summons help!",pcVar15);
        if (iVar10 < 1) {
          pline("But none comes.");
        }
        else if (sum[0] == 0) goto LAB_001c37db;
      }
      else {
        if (flags.soundok == '\0') {
          pcVar15 = " from nowhere";
        }
        else {
          pcVar15 = growl_sound(mtmp);
          pcVar15 = makeplural(pcVar15);
          pline("Something %s!",pcVar15);
          pcVar15 = "";
        }
        if (0 < iVar10) {
          if (sum[0] < 1) {
LAB_001c37db:
            pline("You feel hemmed in.");
          }
          else {
            if (sum[0] == 1) {
              pcVar16 = an((char *)&musable);
              pcVar17 = "%s appears";
            }
            else {
              pcVar16 = makeplural((char *)&musable);
              pcVar17 = "%s appear";
            }
            sprintf(&cc.x,pcVar17,pcVar16);
            pcVar16 = upstart(&cc.x);
            pline("%s%s!",pcVar16,pcVar15);
          }
        }
      }
    }
  }
  if ((u._1052_1_ & 0x10) == 0) {
    musable.misc = (obj *)0x0;
    musable.has_offense = MUSE_NONE;
    musable.has_defense = MUSE_NONE;
    musable.offensive = (obj *)0x0;
    musable.defensive = (obj *)0x0;
    musable.has_misc = MUSE_NONE;
    musable._36_4_ = 0;
    bVar7 = find_offensive(mtmp,&musable);
    if (bVar7 != '\0') {
      iVar10 = use_offensive(mtmp,&musable);
      if (iVar10 != 0) {
        return (uint)(iVar10 == 1);
      }
    }
    uVar21 = 0;
    do {
      if (uVar21 == 6) {
        return 0;
      }
      sum[uVar21] = 0;
      iVar10 = (int)uVar21;
      mattk = getmattk(local_290,iVar10,sum,&alt_attk);
      uVar3 = mattk->aatyp;
      if ((u._1052_1_ & 1) != 0) {
        if (uVar3 == '\v') goto switchD_001c3a29_caseD_b;
        goto LAB_001c4f94;
      }
      switch(uVar3) {
      case '\x01':
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\x10':
        if ((!bVar23) &&
           ((((mtmp->mw == (obj *)0x0 || ((mtmp->field_0x62 & 0x20) != 0)) ||
             (u.uprops[0x15].intrinsic != 0)) ||
            ((u.uprops[0x15].extrinsic != 0 ||
             (youmonst.data != mons + 0xb && youmonst.data != mons + 0xc)))))) {
          if (foundyou == false) {
LAB_001c3cf2:
            wildmiss(mtmp,mattk);
          }
          else {
            iVar10 = rnd(iVar10 + 0x14);
            if (iVar10 < local_294) {
              if ((mattk->aatyp != '\x03') || (((youmonst.data)->mflags1 & 0x200000) == 0)) {
                iVar10 = hitmu(mtmp,mattk);
                goto LAB_001c3fc2;
              }
            }
            else {
              missmu(mtmp,local_294 == iVar10,mattk);
            }
          }
        }
        break;
      case '\a':
        if (((bool)(~bVar23 & 1 < uVar21)) && (sum[uVar21 - 1] != 0)) {
          if (u.ustuck == mtmp || sum[uVar21 - 2] != 0) {
LAB_001c3ede:
            iVar10 = hitmu(mtmp,mattk);
            goto LAB_001c3fc2;
          }
        }
        else if (u.ustuck == mtmp) goto LAB_001c3ede;
        break;
      case '\b':
      case '\t':
      case '\x0e':
        break;
      case '\n':
        if (bVar23) {
          iVar10 = spitmu(mtmp,mattk);
LAB_001c3fc2:
          sum[uVar21] = iVar10;
        }
        break;
      case '\v':
switchD_001c3a29_caseD_b:
        if (!bVar23) {
          if (foundyou == false) {
            ppVar14 = mtmp->data;
            if ((ppVar14->mflags1 & 0x40000) == 0) {
              if (bVar22 != 0) {
                pcVar15 = "splat";
                if (ppVar14 == mons + 0x9f) {
                  pcVar15 = "rushing noise";
                }
                if (ppVar14->mlet == '\x16') {
                  pcVar15 = "rushing noise";
                }
                You_hear("a %s nearby.",pcVar15);
                break;
              }
              pcVar15 = Monnam(mtmp);
              pcVar16 = "%s lunges forward and recoils!";
            }
            else {
              pcVar15 = Monnam(mtmp);
              pcVar16 = "%s gulps some air!";
            }
            pline(pcVar16,pcVar15);
          }
          else {
            if ((u._1052_1_ & 1) == 0) {
              iVar10 = rnd(iVar10 + 0x14);
              if (local_294 <= iVar10) {
                missmu(mtmp,local_294 == iVar10,mattk);
                break;
              }
            }
            flush_screen();
            ptVar18 = t_at(level,(int)u.ux,(int)u.uy);
            iVar10 = dice((uint)mattk->damn,(uint)mattk->damd);
            if ((u._1052_1_ & 1) == 0) {
              iVar12 = 0;
              if (((youmonst.data)->msize < 4) &&
                 (((ptVar18 == (trap *)0x0 || (1 < (byte)((ptVar18->field_0x8 & 0x1f) - 0xb))) ||
                  (poVar13 = sobj_at(0x214,level,(int)u.ux,(int)u.uy), poVar13 == (obj *)0x0)))) {
                if (uball != (obj *)0x0) {
                  unplacebc();
                }
                remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
                mtmp->field_0x62 = mtmp->field_0x62 & 0x7f;
                place_monster(mtmp,(int)u.ux,(int)u.uy);
                u.ustuck = mtmp;
                newsym((int)mtmp->mx,(int)mtmp->my);
                if ((u.usteed != (monst *)0x0 & *(byte *)((long)&mtmp->data->mflags1 + 2) >> 2) == 1
                   ) {
                  pcVar15 = mon_nam(u.usteed);
                  strcpy(&cc.x,pcVar15);
                  pcVar15 = Monnam(mtmp);
                  pline("%s lunges forward and plucks you off %s!",pcVar15,&cc);
                  dismount_steed(4);
                }
                else {
                  Monnam(mtmp);
                  pline("%s engulfs you!");
                }
                stop_occupation();
                reset_occupations();
                if (u.utrap != 0) {
                  pline("You are released from the %s!");
                  u.utrap = 0;
                }
                iVar12 = number_leashed();
                if (0 < iVar12) {
                  pcVar15 = "leashes";
                  if (iVar12 == 1) {
                    pcVar15 = "leash";
                  }
                  pcVar16 = vtense(pcVar15,"snap");
                  pline("The %s %s loose.",pcVar15,pcVar16);
                  unleash_all();
                }
                if ((youmonst.data != mons + 0xb && youmonst.data != mons + 0xc) ||
                   ((mtmp->mintrinsics & 0x80) != 0)) {
                  (*windowprocs.win_pause)(P_MESSAGE);
                  vision_recalc(2);
                  u._1052_1_ = u._1052_1_ | 1;
                  bVar20 = mtmp->m_lev;
                  if (bVar20 < 0x19) {
                    uVar11 = rnd(0x19 - (uint)bVar20);
                    uVar11 = uVar11 >> 1;
                  }
                  else {
                    uVar11 = 0;
                    if (bVar20 != 0x19) {
                      uVar11 = rnd(bVar20 - 0x19);
                      uVar11 = -(uVar11 >> 1);
                    }
                  }
                  iVar12 = uVar11 - (int)u.uac;
                  if (iVar12 < -7) {
                    iVar12 = -8;
                  }
                  u.uswldtim = iVar12 + 10;
                  swallowed(1);
                  obj = &invent;
                  while (obj = &((obj *)obj)->nobj->nobj, (obj *)obj != (obj *)0x0) {
                    snuff_lit((obj *)obj);
                  }
                  goto LAB_001c4141;
                }
                minstapetrify(mtmp,'\x01');
                iVar12 = (uint)(mtmp->mhp < 1) * 2;
              }
            }
            else {
LAB_001c4141:
              iVar12 = 0;
              if (u.ustuck == mtmp) {
                if (u.uswldtim == 0) {
                  bVar24 = true;
                }
                else {
                  u.uswldtim = u.uswldtim - 1;
                  bVar24 = u.uswldtim == 0;
                }
                uVar3 = mattk->adtyp;
                bVar5 = false;
                iVar12 = 0;
                switch(uVar3) {
                case '\0':
                  if (mtmp->data == mons + 0x6e) {
                    pcVar15 = "are smoldering out!";
                    if (((youmonst.data != mons + 0x157 && youmonst.data != mons + 0xa0) &&
                         (youmonst.data != mons + 0x20 && youmonst.data != mons + 0x73)) &&
                       (pcVar15 = "find it mildly uncomfortable.",
                       u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0)) {
                      pcVar15 = "find it mildly uncomfortable.";
                      if ((((youmonst.data)->mflags1 >> 10 & 1) == 0) &&
                         (pcVar15 = "feel comforted.", ((youmonst.data)->mflags1 >> 9 & 1) == 0)) {
                        pcVar15 = "can barely breathe!";
                      }
                    }
                    pline("You are laden with moisture and %s",pcVar15);
                    if (u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) {
                      iVar12 = iVar10;
                      if (youmonst.data != mons + 0x73 && ((youmonst.data)->mflags1 & 0x600) != 0)
                      goto LAB_001c4876;
                    }
                    else {
                      iVar12 = iVar10;
                      if (youmonst.data != mons + 0x73) {
LAB_001c4876:
                        iVar12 = 0;
                        if (youmonst.data == mons + 0x157) {
                          iVar12 = iVar10;
                        }
                        if (youmonst.data == mons + 0xa0) {
                          iVar12 = iVar10;
                        }
                        if (youmonst.data == mons + 0x20) {
                          iVar12 = iVar10;
                        }
                      }
                    }
                    bVar5 = false;
                  }
                  else {
                    pline("You are pummeled with debris!");
LAB_001c4b23:
                    exercise(0,'\0');
LAB_001c4b32:
                    bVar5 = false;
                    iVar12 = iVar10;
                  }
                  break;
                case '\x01':
                case '\x04':
                case '\a':
                case '\t':
                case '\n':
                  break;
                case '\x02':
                  iVar12 = 0;
                  if ((mtmp->field_0x61 & 1) == 0) {
                    uVar11 = mt_random();
                    bVar5 = false;
                    iVar12 = 0;
                    if ((uVar11 & 1) != 0) {
                      if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
                          (((u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
                           ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)
                           ))) && ((youmonst.mintrinsics & 1) == 0)) {
                        pline("You are burning to a crisp!");
                      }
                      fire_damageu(iVar10,mtmp,(char *)0x0,0,0,'\0','\0');
LAB_001c43b0:
                      iVar12 = 0;
                      bVar5 = true;
                    }
                  }
                  break;
                case '\x03':
                  iVar12 = 0;
                  if ((mtmp->field_0x61 & 1) == 0) {
                    uVar11 = mt_random();
                    bVar5 = false;
                    iVar12 = 0;
                    if ((uVar11 & 1) != 0) {
                      if (((u.uprops[2].intrinsic == 0 && u.uprops[2].extrinsic == 0) ||
                          (((u.uprops[2].intrinsic >> 0x1a & 1) != 0 &&
                           ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)
                           ))) && ((youmonst.mintrinsics & 2) == 0)) {
                        pline("You are freezing to death!");
                      }
                      cold_damageu(iVar10,mtmp,(char *)0x0,0,0);
                      goto LAB_001c43b0;
                    }
                  }
                  break;
                case '\x05':
                  iVar12 = 0;
                  if ((mtmp->field_0x61 & 1) == 0) {
                    uVar11 = mt_random();
                    if ((uVar11 & 1) == 0) goto LAB_001c4510;
                    bVar5 = false;
                    iVar12 = 0;
                    if (1 < u.uswldtim) break;
                    if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
                      if ((youmonst.mintrinsics & 8) != 0) goto LAB_001c42ad;
LAB_001c4d32:
                      poVar13 = uarms;
                      if (uarms == (obj *)0x0) {
                        if (uarm == (obj *)0x0) {
                          if (uarmc != (obj *)0x0) {
                            destroy_arm(uarmc,'\x01');
                          }
                          if (uarmu != (obj *)0x0) {
                            destroy_arm(uarmu,'\x01');
                          }
                          pline("You are disintegrated!");
                          bVar5 = false;
                          iVar12 = u.uhp << (u.uprops[0x33].extrinsic != 0 ||
                                            u.uprops[0x33].intrinsic != 0);
                          break;
                        }
                        poVar13 = uarm;
                        if (uarmc != (obj *)0x0) {
                          destroy_arm(uarmc,'\0');
                          poVar13 = uarm;
                        }
                      }
                      destroy_arm(poVar13,'\0');
                    }
                    else {
                      if (((((u.uprops[4].intrinsic >> 0x1a & 1) != 0) &&
                           ((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0)
                           ) && ((youmonst.mintrinsics & 8) == 0)) &&
                         (uVar11 = mt_random(), uVar11 % 10 == 0)) goto LAB_001c4d32;
LAB_001c42ad:
                      shieldeff(u.ux,u.uy);
                      pline("You feel a mild tickle.");
                    }
                    iVar12 = 0;
                    bVar5 = false;
                  }
                  break;
                case '\x06':
                  iVar12 = 0;
                  if ((mtmp->field_0x61 & 1) == 0) {
                    uVar11 = mt_random();
                    bVar5 = false;
                    iVar12 = 0;
                    if ((uVar11 & 1) != 0) {
                      pline("The air around you crackles with electricity.");
                      elec_damageu(iVar10,mtmp,(char *)0x0,0,0,'\0');
                      bVar5 = true;
                      iVar12 = 0;
                    }
                  }
                  break;
                case '\b':
                  if ((u.uprops[7].extrinsic == 0) && ((youmonst.mintrinsics & 0x40) == 0)) {
                    if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_001c4474:
                      pcVar15 = "You are covered in slime!  It burns!";
                    }
                    else {
                      pcVar15 = "Ouch!  You\'ve been slimed!";
                      if (u.umonnum != u.umonster) {
                        bVar7 = dmgtype(youmonst.data,0x24);
                        pcVar15 = "Ouch!  You\'ve been slimed!";
                        if (bVar7 != '\0') goto LAB_001c4474;
                      }
                    }
                    pline(pcVar15);
                    exercise(0,'\0');
                    bVar5 = true;
                    iVar12 = iVar10;
                  }
                  else {
                    pcVar15 = "You are covered with a seemingly harmless goo.";
LAB_001c4507:
                    pline(pcVar15);
LAB_001c4510:
                    bVar5 = false;
                    iVar12 = 0;
                  }
                  break;
                case '\v':
                  bVar7 = can_blnd(mtmp,&youmonst,mattk->aatyp,(obj *)0x0);
                  if (bVar7 != '\0') {
                    if (u.uprops[0x1e].intrinsic != 0) {
LAB_001c43ef:
                      if (ublindf != (obj *)0x0) {
LAB_001c43f4:
                        if (ublindf->oartifact == '\x1d') goto LAB_001c4a97;
                      }
                      make_blinded((ulong)(u.uprops[0x1e].intrinsic + 1),'\0');
                      goto LAB_001c4510;
                    }
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c43f4;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c43ef;
LAB_001c4a97:
                    pline("You can\'t see in here!");
                    make_blinded((long)iVar10,'\0');
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c4ad2;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4ac9;
                    }
                    else {
LAB_001c4ac9:
                      if (ublindf == (obj *)0x0) goto LAB_001c4510;
LAB_001c4ad2:
                      bVar5 = false;
                      iVar12 = 0;
                      if (ublindf->oartifact != '\x1d') break;
                    }
                    pcVar15 = "Your vision quickly clears.";
                    goto LAB_001c4507;
                  }
                  bVar5 = false;
                  iVar12 = 0;
                  break;
                default:
                  if (uVar3 == '!') {
                    bVar7 = diseasemu(mtmp->data);
                    if (bVar7 == '\0') {
                      iVar10 = 0;
                    }
                    goto LAB_001c4b32;
                  }
                  if (uVar3 == '\x1a') {
                    if (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) {
                      u.uswldtim = 0;
                      goto LAB_001c4510;
                    }
                    pcVar15 = Monnam(mtmp);
                    if (!bVar24) {
                      pcVar16 = "";
                      if (u.uswldtim == 1) {
                        pcVar16 = " utterly";
                      }
                      if (u.uswldtim == 2) {
                        pcVar16 = " thoroughly";
                      }
                      pline("%s%s digests you!",pcVar15,pcVar16);
                      goto LAB_001c4b23;
                    }
                    pline("%s totally digests you!",pcVar15);
                    bVar5 = false;
                    iVar12 = u.uhp << (u.uprops[0x33].extrinsic != 0 ||
                                      u.uprops[0x33].intrinsic != 0);
                  }
                }
                if ((!bVar5) && (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0)) {
                  iVar12 = (iVar12 + 1) / 2;
                }
                mdamageu(mtmp,iVar12);
                if (iVar12 != 0) {
                  stop_occupation();
                }
                if ((youmonst.data == mons + 0xb || youmonst.data == mons + 0xc) &&
                   ((mtmp->mintrinsics & 0x80) == 0)) {
                  pcVar15 = Monnam(mtmp);
                  pcVar16 = "regurgitates";
                  if ((mtmp->data->mflags1 >> 0x12 & 1) == 0) {
                    pcVar16 = "expels";
                  }
                  pline("%s very hurriedly %s you!",pcVar15,pcVar16);
                }
                else {
                  if ((u.uswldtim != 0) && (iVar12 = 1, (youmonst.data)->msize < 4))
                  goto LAB_001c4ed1;
                  pcVar15 = "regurgitated";
                  if ((mtmp->data->mflags1 >> 0x12 & 1) == 0) {
                    pcVar15 = "expelled";
                  }
                  pline("You get %s!",pcVar15);
                  if ((flags.verbose != '\0') &&
                     (((mtmp->data->mflags1 & 0x40000) != 0 ||
                      ((bVar7 = dmgtype(mtmp->data,0x1a), bVar7 != '\0' &&
                       (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0)))))) {
                    pcVar15 = mon_nam(mtmp);
                    pline("Obviously %s doesn\'t like your taste.",pcVar15);
                  }
                }
                expels(mtmp,mtmp->data,'\0');
                iVar12 = 1;
              }
            }
LAB_001c4ed1:
            sum[uVar21] = iVar12;
          }
        }
        break;
      case '\f':
        if (bVar23) {
          iVar10 = breamu(mtmp,mattk);
          goto LAB_001c3fc2;
        }
        break;
      case '\r':
        if (bVar23) break;
        uVar11 = *(uint *)&mtmp->field_0x60;
        iVar10 = 0;
        if ((uVar11 >> 8 & 1) != 0) goto LAB_001c4d18;
        if (foundyou == false) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001c4c43;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c459e;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c458e;
            }
            else {
LAB_001c458e:
              pcVar15 = "It";
              if (ublindf == (obj *)0x0) goto LAB_001c4cb1;
LAB_001c459e:
              pcVar15 = "It";
              if (ublindf->oartifact != '\x1d') goto LAB_001c4cb1;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (pcVar15 = "It", ((youmonst.data)->mflags3 & 0x100) != 0)) &&
                (pcVar15 = "It", (viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) &&
               (pcVar15 = "It", (mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001c4c43;
          }
          else {
            bVar7 = worm_known(level,mtmp);
            pcVar15 = "It";
            if (bVar7 != '\0') {
              uVar11 = *(uint *)&mtmp->field_0x60;
LAB_001c4c43:
              if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                pcVar15 = "It";
                if ((uVar11 & 0x280) == 0) goto LAB_001c4c95;
              }
              else {
                pcVar15 = "It";
                if (((uVar11 & 0x280) == 0) &&
                   (pcVar15 = "It", ((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4c95:
                  pcVar15 = "It";
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar15 = Monnam(mtmp);
                  }
                }
              }
            }
          }
LAB_001c4cb1:
          pcVar16 = "thin air";
          if (level->locations[mtmp->mux][mtmp->muy].typ == '\x13') {
            pcVar16 = "empty water";
          }
          pline("%s explodes at a spot in %s!",pcVar15,pcVar16);
          goto LAB_001c4cf5;
        }
        local_2b0 = dice((uint)mattk->damn,(uint)mattk->damd);
        bVar7 = defends((uint)mattk->adtyp,uwep);
        hitmsg(mtmp,mattk);
        switch(mattk->adtyp) {
        case '\x02':
          bVar20 = (byte)youmonst.mintrinsics;
          if (u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) {
LAB_001c48c1:
            bVar20 = bVar20 & 1;
          }
          else {
            bVar20 = 1;
            if (((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
               ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) {
              uVar4 = youmonst.mintrinsics & 1;
              bVar20 = (byte)youmonst.mintrinsics;
joined_r0x001c460b:
              bVar20 = bVar20 & 1;
              if (uVar4 == 0) {
                local_2b0 = (local_2b0 + 1) / 2;
              }
            }
          }
          break;
        case '\x03':
          if (u.uprops[2].intrinsic == 0 && u.uprops[2].extrinsic == 0) {
            bVar20 = (byte)youmonst.mintrinsics >> 1;
            goto LAB_001c48c1;
          }
          bVar20 = 1;
          if (((u.uprops[2].intrinsic >> 0x1a & 1) != 0) &&
             ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)) {
            bVar20 = (byte)(youmonst.mintrinsics >> 1);
            uVar4 = youmonst.mintrinsics & 2;
            goto joined_r0x001c460b;
          }
          break;
        case '\x04':
        case '\x05':
        case '\a':
        case '\b':
        case '\t':
        case '\n':
          goto switchD_001c3ddc_caseD_4;
        case '\x06':
          if (u.uprops[5].intrinsic == 0 && u.uprops[5].extrinsic == 0) {
            bVar20 = (byte)youmonst.mintrinsics >> 4;
            goto LAB_001c48c1;
          }
          bVar20 = 1;
          if (((u.uprops[5].intrinsic >> 0x1a & 1) != 0) &&
             ((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0)) {
            bVar20 = (byte)(youmonst.mintrinsics >> 4);
            uVar4 = youmonst.mintrinsics & 0x10;
            goto joined_r0x001c460b;
          }
          break;
        case '\v':
          bVar7 = resists_blnd(&youmonst);
          if (bVar7 == '\0') {
            uVar11 = *(uint *)&mtmp->field_0x60;
            if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar11 & 0x280) == 0) goto LAB_001c4fdb;
LAB_001c4fe5:
              local_2b0 = local_2b0 / 2;
              iVar10 = rnd(local_2b0);
              if (u.ulevel < iVar10) goto LAB_001c5000;
              if (flags.verbose == '\0') goto LAB_001c4cf5;
              pcVar15 = "You get the impression it was not terribly bright.";
            }
            else {
              if (((uVar11 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
              goto LAB_001c4fe5;
LAB_001c4fdb:
              if ((u._1052_1_ & 0x20) != 0) goto LAB_001c4fe5;
LAB_001c5000:
              pline("You are blinded by a blast of light!");
              make_blinded((long)local_2b0,'\0');
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c5041;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c5038;
              }
              else {
LAB_001c5038:
                if (ublindf == (obj *)0x0) goto LAB_001c4cf5;
LAB_001c5041:
                if (ublindf->oartifact != '\x1d') goto LAB_001c4cf5;
              }
              pcVar15 = "Your vision quickly clears.";
            }
            pline(pcVar15);
            goto LAB_001c4cf5;
          }
          goto LAB_001c48cf;
        default:
          if (mattk->adtyp == '$') {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c4541;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4538;
LAB_001c4b89:
              bVar24 = true;
              if ((u.umonnum != 0x7b) && (u.umonnum != 0xa9)) {
                bVar9 = dmgtype(youmonst.data,0xc);
                bVar24 = bVar9 != '\0';
              }
            }
            else {
LAB_001c4538:
              if (ublindf == (obj *)0x0) {
                bVar24 = true;
              }
              else {
LAB_001c4541:
                bVar24 = true;
                if (ublindf->oartifact == '\x1d') goto LAB_001c4b89;
              }
            }
            if (bVar24 || bVar7 != '\0') goto LAB_001c48cf;
            if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
               ((u.umonnum != u.umonster && (bVar7 = dmgtype(youmonst.data,0x24), bVar7 != '\0'))))
            {
              pline("You are caught in a blast of kaleidoscopic light!");
            }
            bVar7 = make_hallucinated((long)local_2b0 + (ulong)u.uprops[0x23].intrinsic,'\0',0);
            pcVar15 = "are freaked out";
            if (bVar7 == '\0') {
              pcVar15 = "seem unaffected";
            }
            pline("You %s.",pcVar15);
            goto LAB_001c4cf5;
          }
switchD_001c3ddc_caseD_4:
          if (bVar7 != '\0') goto LAB_001c48cf;
          goto LAB_001c4cf5;
        }
        if (bVar20 == 0 && bVar7 == '\0') {
          sVar8 = acurr(3);
          iVar10 = rnd(0x14);
          if (iVar10 < sVar8) {
            pline("You duck some of the blast.");
            local_2b0 = (local_2b0 + 1) / 2;
          }
          else if (flags.verbose != '\0') {
            pline("You get blasted!");
          }
          if (mattk->adtyp == '\x02') {
            burn_away_slime();
          }
          mdamageu(mtmp,local_2b0);
        }
        else {
LAB_001c48cf:
          pline("You seem unaffected by it.");
          ugolemeffects((uint)mattk->adtyp,local_2b0);
        }
LAB_001c4cf5:
        mondead(mtmp);
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
        iVar10 = (uint)(mtmp->mhp < 1) * 2;
LAB_001c4d18:
        sum[uVar21] = iVar10;
        break;
      case '\x0f':
        if (local_290 != mons + 0x127) {
          iVar10 = gazemu(mtmp,mattk);
          goto LAB_001c3fc2;
        }
        break;
      default:
        if (uVar3 == 0xfe) {
          if (bVar23) {
            bVar7 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
            if (bVar7 == '\0') {
              thrwmu(mtmp);
            }
          }
          else {
            if ((mtmp->weapon_check == '\x01') || (mtmp->mw == (obj *)0x0)) {
              mtmp->weapon_check = '\x03';
              iVar12 = mon_wield_item(mtmp);
              if (iVar12 != 0) break;
            }
            if (foundyou == false) goto LAB_001c3cf2;
            otmp = mtmp->mw;
            if (otmp == (obj *)0x0) {
              local_2b0 = 0;
            }
            else {
              local_2b0 = hitval(otmp,&youmonst);
              poVar13 = otmp;
              local_294 = local_294 + local_2b0;
              if (flags.verbose != '\0') {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c3fa0;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c3f97;
LAB_001c46fc:
                  uVar11 = *(uint *)&mtmp->field_0x60;
                  if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar11 & 0x280) == 0) goto LAB_001c4979;
                  }
                  else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001c4979:
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar15 = Monnam(mtmp);
                      pcVar16 = "thrusts";
                      if ((*(ushort *)&objects[poVar13->otyp].field_0x11 & 4) == 0) {
                        pcVar16 = "swings";
                      }
                      iVar12 = pronoun_gender(level,mtmp);
                      pcVar17 = genders[iVar12].his;
                      pcVar19 = singular(poVar13,xname);
                      pline("%s %s %s %s.",pcVar15,pcVar16,pcVar17,pcVar19);
                    }
                  }
                }
                else {
LAB_001c3f97:
                  if (ublindf != (obj *)0x0) {
LAB_001c3fa0:
                    if (ublindf->oartifact == '\x1d') goto LAB_001c46fc;
                  }
                }
              }
            }
            dieroll = rnd(iVar10 + 0x14);
            if (dieroll < local_294) {
              iVar10 = hitmu(mtmp,mattk);
              sum[uVar21] = iVar10;
            }
            else {
              missmu(mtmp,local_294 == dieroll,mattk);
            }
            if (otmp == (obj *)0x0) {
              local_2b0 = 0;
            }
            local_294 = local_294 - local_2b0;
          }
        }
        else if (uVar3 == 0xff) {
          if (bVar23) {
            iVar10 = buzzmu(mtmp,mattk);
          }
          else {
            iVar10 = castmu(mtmp,mattk,'\x01',foundyou);
          }
          goto LAB_001c3fc2;
        }
      }
      if (iflags.botl != '\0') {
        bot();
      }
      iVar10 = sum[uVar21];
      if (((iVar10 == 1) && (u.usleep != 0)) && ((uint)u.usleep < moves)) {
        if (u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) {
          if ((youmonst.mintrinsics & 4) == 0) {
            iVar10 = 10;
            goto LAB_001c4f6d;
          }
        }
        else if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
                 ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
                ((youmonst.mintrinsics & 4) == 0)) {
          iVar10 = 5;
LAB_001c4f6d:
          if ((u.uprops[0x38].extrinsic == 0) && (iVar10 = rn2(iVar10), iVar10 != 0))
          goto LAB_001c4f94;
        }
        multi = -1;
        nomovemsg = "The combat suddenly awakens you.";
      }
      else {
        if (iVar10 == 2) {
          return 1;
        }
        if (iVar10 == 3) {
          return 0;
        }
      }
LAB_001c4f94:
      uVar21 = uVar21 + 1;
    } while( true );
  }
  if (u.ustuck == mtmp) {
    pcVar15 = Monnam(mtmp);
    pcVar16 = "%s loosens its grip slightly.";
    goto LAB_001c522f;
  }
  if (bVar23) {
    return 0;
  }
  if (bVar22 != 0) {
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar13 = which_armor(mtmp,4), poVar13 == (obj *)0x0 ||
        (poVar13 = which_armor(mtmp,4), poVar13->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c390d;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c3908;
      }
      else {
LAB_001c3908:
        if (ublindf != (obj *)0x0) {
LAB_001c390d:
          if (ublindf->oartifact == '\x1d') goto LAB_001c51d0;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001c5220;
      }
LAB_001c51d0:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar10 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar10 < 0x41))))
      goto LAB_001c5220;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar7 = match_warn_of_mon(mtmp), bVar7 == '\0')))) {
      pline("You feel something move nearby.");
      return 0;
    }
  }
LAB_001c5220:
  pcVar15 = Monnam(mtmp);
  pcVar16 = "%s starts to attack you, but pulls back.";
LAB_001c522f:
  pline(pcVar16,pcVar15);
  return 0;
}

Assistant:

int mattacku(struct monst *mtmp)
{
	const struct attack *mattk;
	struct attack alt_attk;
	int	i, j, tmp, sum[NATTK];
	struct musable musable;
	
	const struct permonst *mdat = mtmp->data;
	boolean ranged = (distu(mtmp->mx, mtmp->my) > 3);
		/* Is it near you?  Affects your actions */
	boolean range2 = !monnear(mtmp, mtmp->mux, mtmp->muy);
		/* Does it think it's near you?  Affects its actions */
	boolean foundyou = (mtmp->mux==u.ux && mtmp->muy==u.uy);
		/* Is it attacking you or your image? */
	boolean youseeit = canseemon(level, mtmp);
		/* Might be attacking your image around the corner, or
		 * invisible, or you might be blind....
		 */
	
	if (!ranged) nomul(0, NULL);
	if (mtmp->mhp <= 0 || (Underwater && !is_swimmer(mtmp->data)))
	    return 0;

	/* If swallowed, can only be affected by u.ustuck */
	if (u.uswallow) {
	    if (mtmp != u.ustuck)
		return 0;
	    u.ustuck->mux = u.ux;
	    u.ustuck->muy = u.uy;
	    range2 = 0;
	    foundyou = 1;
	    if (u.uinvulnerable) return 0; /* stomachs can't hurt you! */
	}

	else if (u.usteed) {
		if (mtmp == u.usteed)
			/* Your steed won't attack you */
			return 0;
		/* Orcs like to steal and eat horses and the like */
		if (!rn2(is_orc(mtmp->data) ? 2 : 4) &&
				distu(mtmp->mx, mtmp->my) <= 2) {
			/* Attack your steed instead */
			i = mattackm(mtmp, u.usteed);
			if ((i & MM_AGR_DIED))
				return 1;
			if (i & MM_DEF_DIED || u.umoved)
				return 0;
			/* Let your steed retaliate */
			return !!(mattackm(u.usteed, mtmp) & MM_DEF_DIED);
		}
	}

	if (u.uundetected && !range2 && foundyou && !u.uswallow) {
		u.uundetected = 0;
		if (is_hider(youmonst.data)) {
		    coord cc; /* maybe we need a unexto() function? */
		    struct obj *obj;

		    pline("You fall from the %s!", ceiling(u.ux,u.uy));
		    if (enexto(&cc, level, u.ux, u.uy, youmonst.data)) {
			remove_monster(level, mtmp->mx, mtmp->my);
			newsym(mtmp->mx,mtmp->my);
			place_monster(mtmp, u.ux, u.uy);
			if (mtmp->wormno) worm_move(mtmp);
			teleds(cc.x, cc.y, TRUE);
			set_apparxy(level, mtmp);
			newsym(u.ux,u.uy);
		    } else {
			pline("%s is killed by a falling %s (you)!",
					Monnam(mtmp), mons_mname(youmonst.data));
			killed(mtmp);
			newsym(u.ux,u.uy);
			if (mtmp->mhp > 0) return 0;
			else return 1;
		    }
		    if (youmonst.data->mlet != S_PIERCER)
			return 0;	/* trappers don't attack */

		    obj = which_armor(mtmp, WORN_HELMET);
		    if (obj && is_metallic(obj)) {
			pline("Your blow glances off %s helmet.",
			               s_suffix(mon_nam(mtmp)));
		    } else {
			if (3 + find_mac(mtmp) <= rnd(20)) {
			    pline("%s is hit by a falling piercer (you)!",
								Monnam(mtmp));
			    if ((mtmp->mhp -= dice(3,6)) < 1)
				killed(mtmp);
			} else
			  pline("%s is almost hit by a falling piercer (you)!",
								Monnam(mtmp));
		    }
		} else {
		    if (!youseeit)
			pline("It tries to move where you are hiding.");
		    else {
			/* Ugly kludge for eggs.  The message is phrased so as
			 * to be directed at the monster, not the player,
			 * which makes "laid by you" wrong.  For the
			 * parallelism to work, we can't rephrase it, so we
			 * zap the "laid by you" momentarily instead.
			 */
			struct obj *obj = level->objects[u.ux][u.uy];

			if (obj ||
			      (youmonst.data->mlet == S_EEL && is_pool(level, u.ux, u.uy))) {
			    int save_spe = 0; /* suppress warning */
			    if (obj) {
				save_spe = obj->spe;
				if (obj->otyp == EGG) obj->spe = 0;
			    }
			    if (youmonst.data->mlet == S_EEL)
		pline("Wait, %s!  There's a hidden %s named %s there!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname);
			    else
	     pline("Wait, %s!  There's a %s named %s hiding under %s!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname,
				doname(level->objects[u.ux][u.uy]));
			    if (obj) obj->spe = save_spe;
			} else
			    warning("hiding under nothing?");
		    }
		    newsym(u.ux,u.uy);
		}
		return 0;
	}
	if (youmonst.data->mlet == S_MIMIC && youmonst.m_ap_type &&
		    !range2 && foundyou && !u.uswallow) {
		if (!youseeit) pline("It gets stuck on you.");
		else pline("Wait, %s!  That's a %s named %s!",
			   m_monnam(mtmp), mons_mname(youmonst.data), plname);
		u.ustuck = mtmp;
		youmonst.m_ap_type = M_AP_NOTHING;
		youmonst.mappearance = 0;
		newsym(u.ux,u.uy);
		return 0;
	}

	/* player might be mimicking an object */
	if (youmonst.m_ap_type == M_AP_OBJECT && !range2 && foundyou && !u.uswallow) {
	    if (!youseeit)
		 pline("Something %s!",
			(likes_gold(mtmp->data) && youmonst.mappearance == GOLD_PIECE) ?
			"tries to pick you up" : "disturbs you");
	    else pline("Wait, %s!  That %s is really %s named %s!",
			m_monnam(mtmp),
			mimic_obj_name(&youmonst),
			an(mons_mname(&mons[u.umonnum])),
			plname);
	    if (multi < 0) {	/* this should always be the case */
		char buf[BUFSZ];
		sprintf(buf, "You appear to be %s again.",
			Upolyd ? (const char *) an(mons_mname(youmonst.data)) :
			    (const char *) "yourself");
		unmul(buf);	/* immediately stop mimicking */
	    }
	    return 0;
	}

/*	Work out the armor class differential	*/
	tmp = AC_VALUE(u.uac) + 10;		/* tmp ~= 0 - 20 */
	tmp += mtmp->m_lev;
	if (multi < 0) tmp += 4;
	if ((Invis && !perceives(mdat)) || !mtmp->mcansee)
		tmp -= 2;
	if (mtmp->mtrapped) tmp -= 2;
	if (tmp <= 0) tmp = 1;

	/* make eels visible the moment they hit/miss us */
	if (mdat->mlet == S_EEL && mtmp->minvis && cansee(mtmp->mx,mtmp->my)) {
		mtmp->minvis = 0;
		newsym(mtmp->mx,mtmp->my);
	}

/*	Special demon handling code */
	if (!mtmp->cham && is_demon(mdat) && !range2
	   && mtmp->data != &mons[PM_BALROG]
	   && mtmp->data != &mons[PM_SUCCUBUS]
	   && mtmp->data != &mons[PM_INCUBUS]
	   && (!uwep || uwep->oartifact != ART_DEMONBANE))
	    if (!mtmp->mcan && !rn2(13))	msummon(mtmp, &mtmp->dlevel->z);

/*	Special lycanthrope handling code */
	if (!mtmp->cham && is_were(mdat) && !range2) {

	    if (is_human(mdat)) {
		if (!rn2(5 - (night() * 2)) && !mtmp->mcan) new_were(mtmp);
	    } else if (!rn2(30) && !mtmp->mcan) new_were(mtmp);
	    mdat = mtmp->data;

	    if (!rn2(10) && !mtmp->mcan) {
	    	int numseen, numhelp;
		char buf[BUFSZ], genericwere[BUFSZ];

		strcpy(genericwere, "creature");
		numhelp = were_summon(mdat, FALSE, &numseen, genericwere);
		if (youseeit) {
			pline("%s summons help!", Monnam(mtmp));
			if (numhelp > 0) {
			    if (numseen == 0)
				pline("You feel hemmed in.");
			} else pline("But none comes.");
		} else {
			const char *from_nowhere;

			if (flags.soundok) {
				pline("Something %s!",
					makeplural(growl_sound(mtmp)));
				from_nowhere = "";
			} else from_nowhere = " from nowhere";
			if (numhelp > 0) {
			    if (numseen < 1) pline("You feel hemmed in.");
			    else {
				if (numseen == 1)
			    		sprintf(buf, "%s appears",
							an(genericwere));
			    	else
			    		sprintf(buf, "%s appear",
							makeplural(genericwere));
				pline("%s%s!", upstart(buf), from_nowhere);
			    }
			} /* else no help came; but you didn't know it tried */
		}
	    }
	}

	if (u.uinvulnerable) {
	    /* monsters won't attack you */
	    if (mtmp == u.ustuck)
		pline("%s loosens its grip slightly.", Monnam(mtmp));
	    else if (!range2) {
		if (youseeit || sensemon(mtmp))
		    pline("%s starts to attack you, but pulls back.",
			  Monnam(mtmp));
		else
		    pline("You feel something move nearby.");
	    }
	    return 0;
	}

	/* Unlike defensive stuff, don't let them use item _and_ attack. */
	memset(&musable, 0, sizeof(musable));
	if (find_offensive(mtmp, &musable)) {
		int foo = use_offensive(mtmp, &musable);

		if (foo != 0) return foo==1;
	}

	for (i = 0; i < NATTK; i++) {

	    sum[i] = 0;
	    mattk = getmattk(mdat, i, sum, &alt_attk);
	    if (u.uswallow && (mattk->aatyp != AT_ENGL))
		continue;
	    switch(mattk->aatyp) {
		case AT_CLAW:	/* "hand to hand" attacks */
		case AT_KICK:
		case AT_BITE:
		case AT_STNG:
		case AT_TUCH:
		case AT_BUTT:
		case AT_TENT:
			if (!range2 && (!MON_WEP(mtmp) || mtmp->mconf || Conflict ||
					!touch_petrifies(youmonst.data))) {
			    if (foundyou) {
				if (tmp > (j = rnd(20+i))) {
				    if (mattk->aatyp != AT_KICK ||
					    !thick_skinned(youmonst.data))
					sum[i] = hitmu(mtmp, mattk);
				} else
				    missmu(mtmp, (tmp == j), mattk);
			    } else
				wildmiss(mtmp, mattk);
			}
			break;

		case AT_HUGS:	/* automatic if prev two attacks succeed */
			/* Note: if displaced, prev attacks never succeeded */
			if ((!range2 && i>=2 && sum[i-1] && sum[i-2])
							|| mtmp == u.ustuck)
				sum[i]= hitmu(mtmp, mattk);
			break;

		case AT_GAZE:	/* can affect you either ranged or not */
			/* Medusa gaze already operated through m_respond in
			 * dochug(); don't gaze more than once per round.
			 */
			if (mdat != &mons[PM_MEDUSA])
				sum[i] = gazemu(mtmp, mattk);
			break;

		case AT_EXPL:	/* automatic hit if next to, and aimed at you */
			if (!range2) sum[i] = explmu(mtmp, mattk, foundyou);
			break;

		case AT_ENGL:
			if (!range2) {
			    if (foundyou) {
				if (u.uswallow || tmp > (j = rnd(20+i))) {
				    /* Force swallowing monster to be
				     * displayed even when player is
				     * moving away */
				    flush_screen();
				    sum[i] = gulpmu(mtmp, mattk);
				} else {
				    missmu(mtmp, (tmp == j), mattk);
				}
			    } else if (is_animal(mtmp->data)) {
				pline("%s gulps some air!", Monnam(mtmp));
			    } else {
				if (youseeit)
				    pline("%s lunges forward and recoils!",
					  Monnam(mtmp));
				else
				    You_hear("a %s nearby.",
					     is_whirly(mtmp->data) ?
						"rushing noise" : "splat");
			   }
			}
			break;
		case AT_BREA:
			if (range2) sum[i] = breamu(mtmp, mattk);
			/* Note: breamu takes care of displacement */
			break;
		case AT_SPIT:
			if (range2) sum[i] = spitmu(mtmp, mattk);
			/* Note: spitmu takes care of displacement */
			break;
		case AT_WEAP:
			if (range2) {
				if (!Is_rogue_level(&u.uz))
					thrwmu(mtmp);
			} else {
			    int hittmp = 0;

			    /* Rare but not impossible.  Normally the monster
			     * wields when 2 spaces away, but it can be
			     * teleported or whatever....
			     */
			    if (mtmp->weapon_check == NEED_WEAPON ||
							!MON_WEP(mtmp)) {
				mtmp->weapon_check = NEED_HTH_WEAPON;
				/* mon_wield_item resets weapon_check as
				 * appropriate */
				if (mon_wield_item(mtmp) != 0) break;
			    }
			    if (foundyou) {
				otmp = MON_WEP(mtmp);
				if (otmp) {
				    hittmp = hitval(otmp, &youmonst);
				    tmp += hittmp;
				    mswings(mtmp, otmp);
				}
				if (tmp > (j = dieroll = rnd(20+i)))
				    sum[i] = hitmu(mtmp, mattk);
				else
				    missmu(mtmp, (tmp == j), mattk);
				/* KMH -- Don't accumulate to-hit bonuses */
				if (otmp)
					tmp -= hittmp;
			    } else
				wildmiss(mtmp, mattk);
			}
			break;
		case AT_MAGC:
			if (range2)
			    sum[i] = buzzmu(mtmp, mattk);
			else
			    sum[i] = castmu(mtmp, mattk, TRUE, foundyou);
			break;

		default:		/* no attack */
			break;
	    }
	    if (iflags.botl) bot();
	/* give player a chance of waking up before dying -kaa */
	    if (sum[i] == 1) {	    /* successful attack */
		if (u.usleep && u.usleep < moves &&
		    (FSleep_resistance || !rn2(PSleep_resistance ? 5 : 10))) {
		    multi = -1;
		    nomovemsg = "The combat suddenly awakens you.";
		}
	    }
	    if (sum[i] == 2) return 1;		/* attacker dead */
	    if (sum[i] == 3) break;  /* attacker teleported, no more attacks */
	    /* sum[i] == 0: unsuccessful attack */
	}
	return 0;
}